

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

If_DsdMan_t * If_DsdManLoad(char *pFileName)

{
  Vec_Mem_t *p;
  int iVar1;
  word *pEntry;
  int iVar2;
  int iVar3;
  FILE *__stream;
  If_DsdMan_t *pIVar4;
  void *pvVar5;
  uint *puVar7;
  If_DsdObj_t *pObj;
  Vec_Int_t *Entry;
  Vec_Wrd_t *pVVar8;
  int iVar9;
  uint uVar10;
  int nCapMin;
  char *pcVar11;
  uint Type;
  size_t sVar12;
  long lVar13;
  bool bVar14;
  int Num;
  long local_70;
  If_DsdMan_t *local_68;
  Vec_Int_t *local_60;
  int Num2;
  word *local_50;
  long local_48;
  char pBuffer [10];
  long lVar6;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar11 = "Reading DSD manager file \"%s\" has failed.\n";
  }
  else {
    fread(pBuffer,4,1,__stream);
    if (pBuffer._0_4_ == 0x31647364) {
      fread(&Num,4,1,__stream);
      pIVar4 = If_DsdManAlloc(Num,0);
      free(pIVar4->pStore);
      pcVar11 = Abc_UtilStrsav(pFileName);
      pIVar4->pStore = pcVar11;
      fread(&Num,4,1,__stream);
      pIVar4->LutSize = Num;
      pvVar5 = If_ManSatBuildXY(Num);
      pIVar4->pSat = pvVar5;
      fread(&Num,4,1,__stream);
      iVar3 = Num;
      lVar13 = (long)Num;
      if (lVar13 < 2) {
        __assert_fail("Num >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x46f,"If_DsdMan_t *If_DsdManLoad(char *)");
      }
      iVar2 = (pIVar4->vObjs).nSize;
      if (iVar2 < Num) {
        iVar9 = (pIVar4->vObjs).nCap;
        iVar1 = iVar9 * 2;
        nCapMin = Num;
        if ((iVar1 < Num) || (nCapMin = iVar1, iVar9 < Num)) {
          Vec_PtrGrow(&pIVar4->vObjs,nCapMin);
          iVar2 = (pIVar4->vObjs).nSize;
        }
        for (lVar6 = (long)iVar2; lVar6 < lVar13; lVar6 = lVar6 + 1) {
          (pIVar4->vObjs).pArray[lVar6] = (void *)0x0;
        }
        (pIVar4->vObjs).nSize = iVar3;
      }
      Vec_IntFill(&pIVar4->vNexts,iVar3,0);
      local_60 = &pIVar4->vTruths;
      Vec_IntFill(local_60,iVar3,-1);
      iVar3 = Abc_PrimeCudd(iVar3 * 2);
      pIVar4->nBins = iVar3;
      sVar12 = (long)iVar3 << 2;
      if (pIVar4->pBins == (uint *)0x0) {
        puVar7 = (uint *)malloc(sVar12);
      }
      else {
        puVar7 = (uint *)realloc(pIVar4->pBins,sVar12);
      }
      pIVar4->pBins = puVar7;
      memset(puVar7,0,sVar12);
      lVar13 = 2;
      local_68 = pIVar4;
      while (pIVar4 = local_68, iVar3 = (local_68->vObjs).nSize, lVar13 < iVar3) {
        fread(&Num,4,1,__stream);
        lVar6 = (long)Num;
        pObj = (If_DsdObj_t *)Mem_FlexEntryFetch(pIVar4->pMem,Num * 8);
        fread(pObj,lVar6 << 3,1,__stream);
        (pIVar4->vObjs).pArray[lVar13] = pObj;
        uVar10 = *(uint *)&pObj->field_0x4;
        Type = uVar10 & 7;
        local_70 = lVar13;
        if (Type == 6) {
          fread(&Num,4,1,__stream);
          Vec_IntWriteEntry(local_60,(int)local_70,Num);
          uVar10 = *(uint *)&pObj->field_0x4;
          Type = uVar10 & 7;
        }
        pIVar4 = local_68;
        iVar3 = If_DsdObjTruthId(local_68,pObj);
        puVar7 = If_DsdObjHashLookup(pIVar4,Type,(int *)(pObj + 1),uVar10 >> 0x1b,iVar3);
        if (*puVar7 != 0) {
          __assert_fail("*pSpot == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x482,"If_DsdMan_t *If_DsdManLoad(char *)");
        }
        *puVar7 = pObj->Id;
        lVar13 = local_70 + 1;
      }
      if (local_68->nUniqueMisses != iVar3 + -2) {
        __assert_fail("p->nUniqueMisses == Vec_PtrSize(&p->vObjs) - 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x485,"If_DsdMan_t *If_DsdManLoad(char *)");
      }
      local_68->nUniqueMisses = 0;
      local_50 = (word *)malloc((long)local_68->nWords << 3);
      local_48 = (long)pIVar4->nVars;
      lVar13 = 3;
      while( true ) {
        if (local_48 < lVar13) {
          free(local_50);
          fread(&Num,4,1,__stream);
          pIVar4->nConfigWords = Num;
          fread(&Num,4,1,__stream);
          pIVar4->nTtBits = Num;
          sVar12 = fread(&Num,4,1,__stream);
          if (Num != 0 && (int)sVar12 != 0) {
            lVar13 = (long)Num;
            pVVar8 = Vec_WrdStart(Num);
            pIVar4->vConfigs = pVVar8;
            fread(pVVar8->pArray,lVar13 << 3,1,__stream);
          }
          sVar12 = fread(&Num,4,1,__stream);
          if (Num != 0 && (int)sVar12 != 0) {
            pcVar11 = (char *)calloc((long)Num + 1,1);
            pIVar4->pCellStr = pcVar11;
            fread(pcVar11,(long)Num,1,__stream);
          }
          fclose(__stream);
          return pIVar4;
        }
        p = pIVar4->vTtMem[lVar13];
        iVar3 = p->nEntrySize;
        local_70 = lVar13;
        fread(&Num,4,1,__stream);
        pEntry = local_50;
        iVar2 = Num;
        iVar9 = 0;
        if (0 < Num) {
          iVar9 = Num;
        }
        while (iVar9 != 0) {
          fread(pEntry,(long)(iVar3 << 3),1,__stream);
          Vec_MemHashInsert(p,pEntry);
          iVar9 = iVar9 + -1;
        }
        if (iVar2 != p->nEntries) break;
        fread(&Num2,4,1,__stream);
        local_60 = (Vec_Int_t *)CONCAT44(local_60._4_4_,Num2);
        iVar3 = 0;
        if (0 < Num2) {
          iVar3 = Num2;
        }
        while (bVar14 = iVar3 != 0, iVar3 = iVar3 + -1, bVar14) {
          fread(&Num,4,1,__stream);
          iVar2 = Num;
          lVar13 = (long)Num;
          Entry = Vec_IntAlloc(Num);
          fread(Entry->pArray,lVar13 << 2,1,__stream);
          Entry->nSize = iVar2;
          Vec_PtrPush(local_68->vTtDecs[local_70],Entry);
        }
        lVar13 = local_70 + 1;
        pIVar4 = local_68;
        if ((int)local_60 != local_68->vTtDecs[local_70]->nSize) {
          __assert_fail("Num2 == Vec_PtrSize(p->vTtDecs[v])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                        ,0x49b,"If_DsdMan_t *If_DsdManLoad(char *)");
        }
      }
      __assert_fail("Num == Vec_MemEntryNum(p->vTtMem[v])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                    ,0x491,"If_DsdMan_t *If_DsdManLoad(char *)");
    }
    pcVar11 = "Unrecognized format of file \"%s\".\n";
  }
  printf(pcVar11,pFileName);
  return (If_DsdMan_t *)0x0;
}

Assistant:

If_DsdMan_t * If_DsdManLoad( char * pFileName )
{
    If_DsdMan_t * p;
    If_DsdObj_t * pObj; 
    Vec_Int_t * vSets;
    char pBuffer[10];
    unsigned * pSpot;
    word * pTruth;
    int i, v, Num, Num2, RetValue;
    FILE * pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Reading DSD manager file \"%s\" has failed.\n", pFileName );
        return NULL;
    }
    RetValue = fread( pBuffer, 4, 1, pFile );
    if ( strncmp(pBuffer, DSD_VERSION, strlen(DSD_VERSION)) )
    {
        printf( "Unrecognized format of file \"%s\".\n", pFileName );
        return NULL;
    }
    RetValue = fread( &Num, 4, 1, pFile );
    p = If_DsdManAlloc( Num, 0 );
    ABC_FREE( p->pStore );
    p->pStore = Abc_UtilStrsav( pFileName );
    RetValue = fread( &Num, 4, 1, pFile );
    p->LutSize = Num;
    p->pSat  = If_ManSatBuildXY( p->LutSize );
    RetValue = fread( &Num, 4, 1, pFile );
    assert( Num >= 2 );
    Vec_PtrFillExtra( &p->vObjs, Num, NULL );
    Vec_IntFill( &p->vNexts, Num, 0 );
    Vec_IntFill( &p->vTruths, Num, -1 );
    p->nBins = Abc_PrimeCudd( 2*Num );
    p->pBins = ABC_REALLOC( unsigned, p->pBins, p->nBins );
    memset( p->pBins, 0, sizeof(unsigned) * p->nBins );
    for ( i = 2; i < Vec_PtrSize(&p->vObjs); i++ )
    {
        RetValue = fread( &Num, 4, 1, pFile );
        pObj = (If_DsdObj_t *)Mem_FlexEntryFetch( p->pMem, sizeof(word) * Num );
        RetValue = fread( pObj, sizeof(word)*Num, 1, pFile );
        Vec_PtrWriteEntry( &p->vObjs, i, pObj );
        if ( pObj->Type == IF_DSD_PRIME )
        {
            RetValue = fread( &Num, 4, 1, pFile );
            Vec_IntWriteEntry( &p->vTruths, i, Num );
        }
        pSpot = If_DsdObjHashLookup( p, pObj->Type, (int *)pObj->pFans, pObj->nFans, If_DsdObjTruthId(p, pObj) );
        assert( *pSpot == 0 );
        *pSpot = pObj->Id;
    }
    assert( p->nUniqueMisses == Vec_PtrSize(&p->vObjs) - 2 );
    p->nUniqueMisses = 0;
    pTruth = ABC_ALLOC( word, p->nWords );
    for ( v = 3; v <= p->nVars; v++ )
    {
        int nBytes = sizeof(word)*Vec_MemEntrySize(p->vTtMem[v]);
        RetValue = fread( &Num, 4, 1, pFile );
        for ( i = 0; i < Num; i++ )
        {
            RetValue = fread( pTruth, nBytes, 1, pFile );
            Vec_MemHashInsert( p->vTtMem[v], pTruth );
        }
        assert( Num == Vec_MemEntryNum(p->vTtMem[v]) );
        RetValue = fread( &Num2, 4, 1, pFile );
        for ( i = 0; i < Num2; i++ )
        {
            RetValue = fread( &Num, 4, 1, pFile );
            vSets = Vec_IntAlloc( Num );
            RetValue = fread( Vec_IntArray(vSets), sizeof(int)*Num, 1, pFile );
            vSets->nSize = Num;
            Vec_PtrPush( p->vTtDecs[v], vSets );
        }
        assert( Num2 == Vec_PtrSize(p->vTtDecs[v]) ); 
    }
    ABC_FREE( pTruth );
    RetValue = fread( &Num, 4, 1, pFile );
    p->nConfigWords = Num;
    RetValue = fread( &Num, 4, 1, pFile );
    p->nTtBits = Num;
    RetValue = fread( &Num, 4, 1, pFile );
    if ( RetValue && Num )
    {
        p->vConfigs = Vec_WrdStart( Num );
        RetValue = fread( Vec_WrdArray(p->vConfigs), sizeof(word)*Num, 1, pFile );
    }
    RetValue = fread( &Num, 4, 1, pFile );
    if ( RetValue && Num )
    {
        p->pCellStr = ABC_CALLOC( char, Num + 1 );
        RetValue = fread( p->pCellStr, sizeof(char)*Num, 1, pFile );
    }
    fclose( pFile );
    return p;
}